

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::BuildXformNodeFromStage
               (Stage *stage,XformNode *rootNode,double t,TimeSampleInterpolationType tinterp)

{
  pointer pPVar1;
  bool bVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  TimeSampleInterpolationType in_R8D;
  pointer parent_abs_path;
  bool bVar6;
  byte bVar7;
  matrix4d in_stack_fffffffffffff928;
  allocator local_656;
  allocator local_655;
  TimeSampleInterpolationType local_654;
  XformNode *local_650;
  double local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  string local_5c0;
  string local_5a0;
  undefined1 local_580 [240];
  Prim *local_490;
  int64_t local_488;
  XformNode *local_480;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> local_478;
  undefined2 local_460;
  double local_458;
  double local_450;
  double dStack_448;
  double local_440;
  double dStack_438;
  double local_430;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  double local_408;
  double local_400;
  double dStack_3f8;
  double local_3f0;
  double dStack_3e8;
  double local_3e0;
  double dStack_3d8;
  double local_3d0;
  double dStack_3c8;
  double local_3c0;
  double dStack_3b8;
  double local_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  double local_380;
  double dStack_378;
  double local_370;
  double dStack_368;
  double local_360;
  double dStack_358;
  double local_350;
  double dStack_348;
  double local_340;
  double dStack_338;
  double local_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double local_300;
  double dStack_2f8;
  double local_2f0;
  double dStack_2e8;
  double local_2e0;
  XformNode node;
  
  bVar7 = 0;
  if (rootNode == (XformNode *)0x0) {
    bVar6 = false;
  }
  else {
    local_654 = tinterp;
    local_650 = rootNode;
    local_648 = t;
    XformNode::XformNode((XformNode *)local_580);
    ::std::__cxx11::string::assign((char *)local_580);
    ::std::__cxx11::string::string((string *)&local_5a0,"/",&local_655);
    ::std::__cxx11::string::string((string *)&local_5c0,"",&local_656);
    Path::Path((Path *)&node,&local_5a0,&local_5c0);
    Path::operator=((Path *)(local_580 + 0x20),(Path *)&node);
    Path::~Path((Path *)&node);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    local_460._0_1_ = false;
    local_460._1_1_ = false;
    local_480 = (XformNode *)0x0;
    local_490 = (Prim *)0x0;
    local_488 = -1;
    local_350 = 0.0;
    dStack_348 = 0.0;
    local_340 = 0.0;
    dStack_338 = 0.0;
    local_328 = 0.0;
    dStack_320 = 0.0;
    local_318 = 0.0;
    dStack_310 = 0.0;
    local_300 = 0.0;
    dStack_2f8 = 0.0;
    local_2f0 = 0.0;
    dStack_2e8 = 0.0;
    local_330 = 1.0;
    local_308 = 1.0;
    local_2e0 = 1.0;
    local_3c0 = 0.0;
    dStack_3b8 = 0.0;
    local_3d0 = 0.0;
    dStack_3c8 = 0.0;
    local_398 = 0.0;
    dStack_390 = 0.0;
    local_3a8 = 0.0;
    dStack_3a0 = 0.0;
    local_370 = 0.0;
    dStack_368 = 0.0;
    local_380 = 0.0;
    dStack_378 = 0.0;
    local_3b0 = 1.0;
    local_388 = 1.0;
    local_360 = 1.0;
    dStack_358 = 1.0;
    local_450 = 0.0;
    dStack_448 = 0.0;
    local_440 = 0.0;
    dStack_438 = 0.0;
    local_418 = 0.0;
    dStack_410 = 0.0;
    local_428 = 0.0;
    dStack_420 = 0.0;
    local_3f0 = 0.0;
    dStack_3e8 = 0.0;
    local_400 = 0.0;
    dStack_3f8 = 0.0;
    local_458 = 1.0;
    local_430 = 1.0;
    local_408 = 1.0;
    local_3e0 = 1.0;
    dStack_3d8 = 1.0;
    pPVar1 = (stage->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (parent_abs_path =
              (stage->_root_nodes).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start; bVar6 = parent_abs_path == pPVar1, !bVar6;
        parent_abs_path = parent_abs_path + 1) {
      XformNode::XformNode(&node);
      local_628 = 0;
      uStack_620 = 0;
      local_638 = 0;
      uStack_630 = 0;
      local_600 = 0;
      uStack_5f8 = 0;
      local_610 = 0;
      uStack_608 = 0;
      local_5d8 = 0;
      uStack_5d0 = 0;
      local_5e8 = 0;
      uStack_5e0 = 0;
      local_640 = 0x3ff0000000000000;
      local_618 = 0x3ff0000000000000;
      local_5f0 = 0x3ff0000000000000;
      local_5c8 = 0x3ff0000000000000;
      puVar4 = &local_640;
      puVar5 = (undefined8 *)&stack0xfffffffffffff928;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      bVar2 = anon_unknown_6::BuildXformNodeFromStageRec
                        ((Stage *)(local_580 + 0x20),&parent_abs_path->_abs_path,(Prim *)&node,
                         (XformNode *)(ulong)local_654,in_stack_fffffffffffff928,local_648,in_R8D);
      if (!bVar2) {
        XformNode::~XformNode(&node);
        goto LAB_003b905d;
      }
      ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
      emplace_back<tinyusdz::tydra::XformNode>(&local_478,&node);
      XformNode::~XformNode(&node);
    }
    XformNode::operator=(local_650,(XformNode *)local_580);
LAB_003b905d:
    XformNode::~XformNode((XformNode *)local_580);
  }
  return bVar6;
}

Assistant:

bool BuildXformNodeFromStage(
    const tinyusdz::Stage &stage, XformNode *rootNode, /* out */
    const double t,
    const tinyusdz::value::TimeSampleInterpolationType tinterp) {
  if (!rootNode) {
    return false;
  }

  XformNode stage_root;
  stage_root.element_name = "";  // Stage root element name is empty.
  stage_root.absolute_path = Path("/", "");
  stage_root.has_xform() = false;
  stage_root.parent = nullptr;
  stage_root.prim = nullptr;  // No prim for stage root.
  stage_root.prim_id = -1;
  stage_root.has_resetXformStack() = false;
  stage_root.set_parent_world_matrix(value::matrix4d::identity());
  stage_root.set_world_matrix(value::matrix4d::identity());
  stage_root.set_local_matrix(value::matrix4d::identity());

  for (const auto &root : stage.root_prims()) {
    XformNode node;

    value::matrix4d rootMat{value::matrix4d::identity()};

    if (!BuildXformNodeFromStageRec(stage, stage_root.absolute_path, &root,
                                    &node, rootMat, t, tinterp)) {
      return false;
    }

    stage_root.children.emplace_back(std::move(node));
  }

  (*rootNode) = stage_root;

  return true;
}